

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint LodePNGIText_copy(LodePNGInfo *dest,LodePNGInfo *source)

{
  uint uVar1;
  long in_RSI;
  long in_RDI;
  uint error;
  char *unaff_retaddr;
  size_t i;
  LodePNGInfo *in_stack_00000020;
  long local_20;
  
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  local_20 = 0;
  while( true ) {
    if (local_20 == *(long *)(in_RSI + 0x60)) {
      return 0;
    }
    uVar1 = lodepng_add_itext(in_stack_00000020,(char *)dest,(char *)source,(char *)i,unaff_retaddr)
    ;
    if (uVar1 != 0) break;
    local_20 = local_20 + 1;
  }
  return uVar1;
}

Assistant:

static unsigned LodePNGIText_copy(LodePNGInfo* dest, const LodePNGInfo* source) {
  size_t i = 0;
  dest->itext_keys = NULL;
  dest->itext_langtags = NULL;
  dest->itext_transkeys = NULL;
  dest->itext_strings = NULL;
  dest->itext_num = 0;
  for(i = 0; i != source->itext_num; ++i) {
    CERROR_TRY_RETURN(lodepng_add_itext(dest, source->itext_keys[i], source->itext_langtags[i],
                                        source->itext_transkeys[i], source->itext_strings[i]));
  }
  return 0;
}